

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::SerializeGroupTo<google::protobuf::io::CodedOutputStream>
               (MessageLite *msg,void *table_ptr,CodedOutputStream *output)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (table_ptr != (void *)0x0) {
    SerializeInternal((uint8 *)msg,(FieldMetadata *)(*(long *)((long)table_ptr + 8) + 0x18),
                      *table_ptr + -1,output);
    return;
  }
  iVar1 = (*msg->_vptr_MessageLite[0xc])(msg,output->cur_,output);
  output->cur_ = (uint8 *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

void SerializeGroupTo(const MessageLite* msg, const void* table_ptr,
                      O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8* base = reinterpret_cast<const uint8*>(msg);
  int cached_size = *reinterpret_cast<const int32*>(base + field_table->offset);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}